

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# disassembler.cpp
# Opt level: O2

void __thiscall LLVMBC::StreamState::append(StreamState *this,MDOperand *md)

{
  FILE *__stream;
  MetadataKind MVar1;
  NamedMDNode *md_00;
  MDString *this_00;
  String *ts;
  MDNode *md_01;
  ConstantAsMetadata *this_01;
  Constant *value;
  LoggingCallback p_Var2;
  void *pvVar3;
  char buffer [4096];
  
  if (md == (MDOperand *)0x0) {
switchD_0017c91c_caseD_4:
    std::operator<<((ostream *)this,"null");
    return;
  }
  MVar1 = MDOperand::get_metadata_kind(md);
  switch(MVar1) {
  case NamedNode:
    md_00 = cast<LLVMBC::NamedMDNode>(md);
    append(this,md_00);
    return;
  case Node:
    md_01 = cast<LLVMBC::MDNode>(md);
    append(this,md_01,false);
    return;
  case Constant:
    this_01 = cast<LLVMBC::ConstantAsMetadata>(md);
    value = ConstantAsMetadata::getValue(this_01);
    append(this,&value->super_Value,false);
    return;
  case String:
    this_00 = cast<LLVMBC::MDString>(md);
    ts = MDString::getString_abi_cxx11_(this_00);
    append<char_const(&)[2],std::__cxx11::basic_string<char,std::char_traits<char>,dxil_spv::ThreadLocalAllocator<char>>const&,char_const(&)[2]>
              (this,(char (*) [2])0x1a1ec4,ts,(char (*) [2])0x1a1ec4);
    return;
  case None:
    goto switchD_0017c91c_caseD_4;
  default:
    p_Var2 = dxil_spv::get_thread_log_callback();
    __stream = _stderr;
    if (p_Var2 == (LoggingCallback)0x0) {
      MVar1 = MDOperand::get_metadata_kind(md);
      fprintf(__stream,"[ERROR]: Unknown MetadataKind %u.\n",(ulong)MVar1);
      fflush(_stderr);
      return;
    }
    MVar1 = MDOperand::get_metadata_kind(md);
    snprintf(buffer,0x1000,"Unknown MetadataKind %u.\n",(ulong)MVar1);
    pvVar3 = dxil_spv::get_thread_log_callback_userdata();
    (*p_Var2)(pvVar3,Error,buffer);
    return;
  }
}

Assistant:

void StreamState::append(MDOperand *md)
{
	if (md)
	{
		switch (md->get_metadata_kind())
		{
		case MetadataKind::NamedNode:
			return append(cast<NamedMDNode>(md));
		case MetadataKind::Node:
			return append(cast<MDNode>(md), false);
		case MetadataKind::Constant:
			return append(cast<ConstantAsMetadata>(md)->getValue());
		case MetadataKind::String:
			return append("\"", cast<MDString>(md)->getString(), "\"");
		case MetadataKind::None:
			return append("null");
		default:
			LOGE("Unknown MetadataKind %u.\n", unsigned(md->get_metadata_kind()));
			break;
		}
	}
	else
		append("null");
}